

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_13b3daf::FileSetType::WriteProperties<cmValue>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,cmValue value,
          bool clear)

{
  cmMakefile *pcVar1;
  string_view description;
  string_view description_00;
  bool bVar2;
  cmAlphaNum *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view sVar3;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  cmAlphaNum local_b0;
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_68;
  cmAlphaNum local_60;
  
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  bVar2 = std::operator==(__x,(this->DefaultDirectoryProperty).super_string_view);
  if (bVar2) {
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_b0,&this->TypeName,(allocator<char> *)&local_60);
    cmTargetInternals::AddDirectoryToFileSet<cmValue>
              (impl,tgt,(string *)&local_b0,value,(this->TypeName).super_string_view,
               (this->DefaultDescription).super_string_view,true);
  }
  else {
    __x_00._M_str = (prop->_M_dataplus)._M_p;
    __x_00._M_len = prop->_M_string_length;
    bVar2 = std::operator==(__x_00,(this->DefaultPathProperty).super_string_view);
    if (!bVar2) {
      sVar3._M_str = (prop->_M_dataplus)._M_p;
      sVar3._M_len = prop->_M_string_length;
      bVar2 = cmHasPrefix(sVar3,(this->DirectoryPrefix).super_string_view);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
        if (fileSetName._M_string_length == 0) {
          pcVar1 = impl->Makefile;
          local_b0.View_._M_len = (this->ArbitraryDescription).super_string_view._M_len;
          local_b0.View_._M_str = (this->ArbitraryDescription).super_string_view._M_str;
          local_60.View_._M_len = 0x16;
          local_60.View_._M_str = " name cannot be empty.";
          cmStrCat<>(&local_f0,&local_b0,&local_60);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
        }
        else {
          sVar3 = (this->TypeName).super_string_view;
          local_b0.View_._M_len = (this->ArbitraryDescription).super_string_view._M_len;
          local_b0.View_._M_str = (this->ArbitraryDescription).super_string_view._M_str;
          local_60.View_._M_len = 2;
          local_60.View_._M_str = " \"";
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_f0,&local_b0,&local_60,&fileSetName,(char (*) [2])0x599acd);
          local_70 = local_f0._M_string_length;
          pcStack_68 = local_f0._M_dataplus._M_p;
          description._M_str = local_f0._M_dataplus._M_p;
          description._M_len = local_f0._M_string_length;
          cmTargetInternals::AddDirectoryToFileSet<cmValue>
                    (impl,tgt,&fileSetName,value,sVar3,description,true);
        }
LAB_0039bc39:
        std::__cxx11::string::~string((string *)&local_f0);
      }
      else {
        str._M_str = (prop->_M_dataplus)._M_p;
        str._M_len = prop->_M_string_length;
        bVar2 = cmHasPrefix(str,(this->PathPrefix).super_string_view);
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
          if (fileSetName._M_string_length == 0) {
            pcVar1 = impl->Makefile;
            local_b0.View_._M_len = (this->ArbitraryDescription).super_string_view._M_len;
            local_b0.View_._M_str = (this->ArbitraryDescription).super_string_view._M_str;
            local_60.View_._M_len = 0x16;
            local_60.View_._M_str = " name cannot be empty.";
            cmStrCat<>(&local_f0,&local_b0,&local_60);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
          }
          else {
            sVar3 = (this->TypeName).super_string_view;
            local_b0.View_._M_len = (this->ArbitraryDescription).super_string_view._M_len;
            local_b0.View_._M_str = (this->ArbitraryDescription).super_string_view._M_str;
            local_60.View_._M_len = 2;
            local_60.View_._M_str = " \"";
            cmStrCat<std::__cxx11::string,char[2]>
                      (&local_f0,&local_b0,&local_60,&fileSetName,(char (*) [2])0x599acd);
            local_80 = local_f0._M_string_length;
            pcStack_78 = local_f0._M_dataplus._M_p;
            description_00._M_str = local_f0._M_dataplus._M_p;
            description_00._M_len = local_f0._M_string_length;
            cmTargetInternals::AddPathToFileSet<cmValue>
                      (impl,tgt,&fileSetName,value,sVar3,description_00,true);
          }
          goto LAB_0039bc39;
        }
        __x_01._M_str = (prop->_M_dataplus)._M_p;
        __x_01._M_len = prop->_M_string_length;
        bVar2 = std::operator==(__x_01,(this->SelfEntries).PropertyName.super_string_view);
        if (bVar2) {
          pcVar1 = impl->Makefile;
          local_b0.View_._M_len = (this->SelfEntries).PropertyName.super_string_view._M_len;
          local_b0.View_._M_str = (this->SelfEntries).PropertyName.super_string_view._M_str;
          local_60.View_._M_len = 0x17;
          local_60.View_._M_str = " property is read-only\n";
          cmStrCat<>(&fileSetName,&local_b0,&local_60);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&fileSetName);
        }
        else {
          __x_02._M_str = (prop->_M_dataplus)._M_p;
          __x_02._M_len = prop->_M_string_length;
          bVar2 = std::operator==(__x_02,(this->InterfaceEntries).PropertyName.super_string_view);
          if (!bVar2) {
            return false;
          }
          pcVar1 = impl->Makefile;
          local_b0.View_._M_len = (this->InterfaceEntries).PropertyName.super_string_view._M_len;
          local_b0.View_._M_str = (this->InterfaceEntries).PropertyName.super_string_view._M_str;
          local_60.View_._M_len = 0x17;
          local_60.View_._M_str = " property is read-only\n";
          cmStrCat<>(&fileSetName,&local_b0,&local_60);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&fileSetName);
        }
      }
      this_00 = (cmAlphaNum *)&fileSetName;
      goto LAB_0039bc48;
    }
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_b0,&this->TypeName,(allocator<char> *)&local_60);
    cmTargetInternals::AddPathToFileSet<cmValue>
              (impl,tgt,(string *)&local_b0,value,(this->TypeName).super_string_view,
               (this->DefaultDescription).super_string_view,true);
  }
  this_00 = &local_b0;
LAB_0039bc48:
  std::__cxx11::string::~string((string *)this_00);
  return true;
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}